

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
I2sSimulationDataGenerator::I2sSimulationDataGenerator(I2sSimulationDataGenerator *this)

{
  I2sSimulationDataGenerator *this_local;
  
  SimulationChannelDescriptorGroup::SimulationChannelDescriptorGroup(&this->mSimulationChannels);
  std::vector<long_long,_std::allocator<long_long>_>::vector(&this->mSineWaveSamplesRight);
  std::vector<long_long,_std::allocator<long_long>_>::vector(&this->mSineWaveSamplesLeft);
  ClockGenerator::ClockGenerator(&this->mClockGenerator);
  std::vector<BitState,_std::allocator<BitState>_>::vector(&this->mFrameBits);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector(&this->mBitMasks);
  this->mAudioSampleRate = 3520.0;
  this->mUseShortFrames = false;
  this->mNumPaddingBits = 0;
  return;
}

Assistant:

I2sSimulationDataGenerator::I2sSimulationDataGenerator()
    : mNumPaddingBits( 0 ),
      /*mAudioSampleRate( 44000*2 ),*/
      mAudioSampleRate( 220 * 16 ),
      mUseShortFrames( false )
{
}